

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O2

void __thiscall MIDIStreamer::~MIDIStreamer(MIDIStreamer *this)

{
  (this->super_MusInfo)._vptr_MusInfo = (_func_int **)&PTR__MIDIStreamer_006eaa08;
  Stop(this);
  if (this->MIDI != (MIDIDevice *)0x0) {
    (*this->MIDI->_vptr_MIDIDevice[1])();
  }
  FString::~FString(&this->Args);
  FString::~FString(&this->DumpFilename);
  MusInfo::~MusInfo(&this->super_MusInfo);
  return;
}

Assistant:

MIDIStreamer::~MIDIStreamer()
{
	Stop();
#ifdef _WIN32
	if (ExitEvent != NULL)
	{
		CloseHandle(ExitEvent);
	}
	if (BufferDoneEvent != NULL)
	{
		CloseHandle(BufferDoneEvent);
	}
#endif
	if (MIDI != NULL)
	{
		delete MIDI;
	}
}